

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superscalar.cpp
# Opt level: O0

bool defyx::selectRegister
               (vector<int,_std::allocator<int>_> *availableRegisters,Blake2Generator *gen,int *reg)

{
  uint32_t uVar1;
  size_type sVar2;
  ulong uVar3;
  reference pvVar4;
  value_type *in_RDX;
  vector<int,_std::allocator<int>_> *in_RDI;
  int index;
  Blake2Generator *in_stack_ffffffffffffffd0;
  undefined4 local_24;
  undefined1 local_1;
  
  sVar2 = std::vector<int,_std::allocator<int>_>::size(in_RDI);
  if (sVar2 == 0) {
    local_1 = false;
  }
  else {
    sVar2 = std::vector<int,_std::allocator<int>_>::size(in_RDI);
    if (sVar2 < 2) {
      local_24 = 0;
    }
    else {
      uVar1 = Blake2Generator::getUInt32(in_stack_ffffffffffffffd0);
      uVar3 = (ulong)uVar1;
      sVar2 = std::vector<int,_std::allocator<int>_>::size(in_RDI);
      local_24 = (int)(uVar3 % sVar2);
    }
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](in_RDI,(long)local_24);
    *in_RDX = *pvVar4;
    local_1 = true;
  }
  return local_1;
}

Assistant:

static bool selectRegister(std::vector<int>& availableRegisters, Blake2Generator& gen, int& reg) {
		int index;
		if (availableRegisters.size() == 0)
			return false;

		if (availableRegisters.size() > 1) {
			index = gen.getUInt32() % availableRegisters.size();
		}
		else {
			index = 0;
		}
		reg = availableRegisters[index];
		return true;
	}